

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

map * map_init(void)

{
  int iVar1;
  map *pmVar2;
  map_entry **ppmVar3;
  
  pmVar2 = (map *)malloc(0x60);
  if (pmVar2 != (map *)0x0) {
    pmVar2->length = 4;
    pmVar2->bucket_count = 0;
    ppmVar3 = (map_entry **)calloc(4,0x18);
    pmVar2->entries = ppmVar3;
    if (ppmVar3 != (map_entry **)0x0) {
      iVar1 = pthread_mutex_init((pthread_mutex_t *)&pmVar2->mutex,(pthread_mutexattr_t *)0x0);
      if (iVar1 != 0) {
        return (map *)0x0;
      }
      pmVar2->hash_function = default_hash_function;
      pmVar2->key_size_function = default_key_size_function;
      pmVar2->key_compare_function = default_key_compare_function;
      pmVar2->free_function = (map_entry_free_function_t)0x0;
      pmVar2->setting_flags = MAP_FLAG_IGNORE_THRESHOLDS_EMPTY;
      pmVar2->event_flags = EVENT_FLAG_NORMAL;
      return pmVar2;
    }
  }
  return (map *)0x0;
}

Assistant:

struct map *map_init(void)
{
        struct map *map = malloc(sizeof(struct map));

        if (map == NULL) {
                return NULL;
        }

        map->length = MAP_MIN_LENGTH;
        map->bucket_count = 0;
        map->entries = calloc(map->length, sizeof(struct map_entry));

        if (map->entries == NULL) {
                return NULL;
        }

        if (pthread_mutex_init(&map->mutex, NULL) != 0) {
                return NULL;
        }

        map->hash_function = default_hash_function;
        map->key_size_function = default_key_size_function;
        map->key_compare_function = default_key_compare_function;
        map->free_function = NULL;
        map->setting_flags = MAP_FLAG_IGNORE_THRESHOLDS_EMPTY;
        map->event_flags = EVENT_FLAG_NORMAL;

        return map;
}